

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeventqueue.cpp
# Opt level: O0

void __thiscall
QXcbEventQueue::waitForNewEvents
          (QXcbEventQueue *this,QXcbEventNode *sinceFlushedTail,unsigned_long time)

{
  long lVar1;
  QXcbEventNode *in_RSI;
  QXcbEventQueue *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)in_RDI,in_stack_ffffffffffffffb8);
  flushBufferedEvents(in_RDI);
  if (in_RSI == in_RDI->m_flushedTail) {
    QWaitCondition::wait((QMutex *)&in_RDI->m_newEventsCondition,(ulong)&in_RDI->m_newEventsMutex);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbEventQueue::waitForNewEvents(const QXcbEventNode *sinceFlushedTail,
                                      unsigned long time)
{
    QMutexLocker locker(&m_newEventsMutex);
    flushBufferedEvents();
    if (sinceFlushedTail != m_flushedTail)
        return;
    m_newEventsCondition.wait(&m_newEventsMutex, time);
}